

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recursive_descent_parser.cpp
# Opt level: O3

JsonValue * __thiscall MercuryJson::JSON::_parse_array(JSON *this)

{
  char encountered;
  ulong *puVar1;
  JsonArray *args;
  JsonArray *pJVar2;
  JsonValue *pJVar3;
  runtime_error *this_00;
  ulong uVar4;
  JsonArray *pJVar5;
  
  uVar4 = *this->idx_ptr;
  if (this->input[uVar4] == ']') {
    this->idx_ptr = this->idx_ptr + 1;
    if (uVar4 < this->input_len) {
      args = (JsonArray *)0x0;
LAB_0010ef50:
      pJVar3 = BlockAllocator<MercuryJson::JsonValue>::
               construct<MercuryJson::JsonValue,MercuryJson::JsonArray*>(&this->allocator,args);
      return pJVar3;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"text ended prematurely");
  }
  else {
    pJVar3 = _parse_value(this);
    args = BlockAllocator<MercuryJson::JsonValue>::
           construct<MercuryJson::JsonArray,MercuryJson::JsonValue*>(&this->allocator,pJVar3);
    puVar1 = this->idx_ptr;
    this->idx_ptr = puVar1 + 1;
    uVar4 = *puVar1;
    pJVar5 = args;
    if (uVar4 < this->input_len) {
      do {
        encountered = this->input[uVar4];
        if (encountered != ',') {
          if (encountered != ']') {
            _error(this,"\',\'",encountered,uVar4);
          }
          goto LAB_0010ef50;
        }
        pJVar3 = _parse_value(this);
        pJVar2 = BlockAllocator<MercuryJson::JsonValue>::
                 construct<MercuryJson::JsonArray,MercuryJson::JsonValue*>(&this->allocator,pJVar3);
        pJVar5->next = pJVar2;
        puVar1 = this->idx_ptr;
        this->idx_ptr = puVar1 + 1;
        uVar4 = *puVar1;
        pJVar5 = pJVar2;
      } while (uVar4 < this->input_len);
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"text ended prematurely");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

JsonValue *JSON::_parse_array() {
        size_t idx;
        char ch;
        peek_char();
        if (ch == ']') {
            next_char();
            return allocator.construct(static_cast<JsonArray *>(nullptr));
        }
        JsonValue *value = _parse_value();
        auto *array = allocator.construct<JsonArray>(value), *ptr = array;
        while (true) {
            next_char();
            if (ch == ']') break;
            expect(',');
            value = _parse_value();
            ptr = ptr->next = allocator.construct<JsonArray>(value);
        }
        return allocator.construct(array);
    }